

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

QString * __thiscall QSqlRelationalTableModel::orderByClause(QSqlRelationalTableModel *this)

{
  bool bVar1;
  QSqlRelationalTableModelPrivate *pQVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QSqlRelationalTableModelPrivate *d;
  QString f;
  QSqlRelation rel;
  QSqlRelation *in_stack_fffffffffffffef8;
  QSqlRelationalTableModelPrivate *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QSqlRelationalTableModelPrivate *this_00;
  undefined1 local_c0 [72];
  QString local_78;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSqlRelationalTableModel *)0x15b842);
  memset(local_50,0xaa,0x48);
  QList<QSharedPointer<QRelation>_>::value
            ((QList<QSharedPointer<QRelation>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),(qsizetype)in_RSI);
  bVar1 = QSharedPointer::operator_cast_to_bool((QSharedPointer<QRelation> *)0x15b890);
  if (bVar1) {
    QList<QSharedPointer<QRelation>_>::at
              ((QList<QSharedPointer<QRelation>_> *)in_stack_ffffffffffffff00,
               (qsizetype)in_stack_fffffffffffffef8);
    QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15b8bb);
    QSqlRelation::QSqlRelation((QSqlRelation *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    QSqlRelation::QSqlRelation((QSqlRelation *)in_stack_ffffffffffffff00);
  }
  QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x15b8e7);
  bVar1 = QSqlRelation::isValid((QSqlRelation *)in_stack_ffffffffffffff00);
  if (bVar1) {
    local_78.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_78.d.size = -0x5555555555555556;
    this_00 = pQVar2;
    QSqlRelationalTableModelSql::relTablePrefix((int)((ulong)in_RSI >> 0x20));
    QSqlRelation::displayColumn(in_stack_fffffffffffffef8);
    QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
              (this_00,(QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_RSI);
    QString::~QString((QString *)0x15b998);
    QString::~QString((QString *)0x15b9a2);
    if ((this_00->super_QSqlTableModelPrivate).sortOrder == AscendingOrder) {
      QSqlQueryModelSql::asc((QString *)this_00);
      in_stack_ffffffffffffff00 = pQVar2;
    }
    else {
      QSqlQueryModelSql::desc((QString *)this_00);
      in_stack_ffffffffffffff00 = pQVar2;
    }
    QString::operator=(&local_78,(QString *)local_c0);
    QString::~QString((QString *)0x15b9f2);
    QSqlQueryModelSql::orderBy(in_RSI);
    QString::~QString((QString *)0x15ba19);
  }
  else {
    QSqlTableModel::orderByClause
              ((QSqlTableModel *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  QSqlRelation::~QSqlRelation((QSqlRelation *)in_stack_ffffffffffffff00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlRelationalTableModel::orderByClause() const
{
    Q_D(const QSqlRelationalTableModel);

    const QSqlRelation rel = d->relations.value(d->sortColumn) ? d->relations.at(d->sortColumn)->rel : QSqlRelation();
    if (!rel.isValid())
        return QSqlTableModel::orderByClause();

    QString f = d->fullyQualifiedFieldName(SqlrTm::relTablePrefix(d->sortColumn), rel.displayColumn());
    f = d->sortOrder == Qt::AscendingOrder ? SqlrTm::asc(f) : SqlrTm::desc(f);
    return SqlrTm::orderBy(f);
}